

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  IConfig *pIVar1;
  allocator local_61;
  Ptr<Catch::IConfig> local_60;
  string local_58;
  string local_38;
  
  (this->m_xml).m_os = (this->m_config).m_stream;
  std::__cxx11::string::string((string *)&local_58,"Catch",(allocator *)&local_38);
  XmlWriter::startElement(&this->m_xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pIVar1 = (this->m_config).m_fullConfig.m_p;
  local_38._M_dataplus._M_p = (pointer)pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_58,pIVar1);
  std::__cxx11::string::~string((string *)&local_58);
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&local_38);
  if (local_58._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_58,"name",&local_61);
    pIVar1 = (this->m_config).m_fullConfig.m_p;
    local_60.m_p = pIVar1;
    if (pIVar1 != (IConfig *)0x0) {
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_38,pIVar1);
    XmlWriter::writeAttribute(&this->m_xml,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    Ptr<Catch::IConfig>::~Ptr(&local_60);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml.setStream( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }